

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O3

Clause * __thiscall
Saturation::PredicateSplitPassiveClauseContainer::popSelected
          (PredicateSplitPassiveClauseContainer *this)

{
  int *piVar1;
  pointer puVar2;
  uint *puVar3;
  PassiveClauseContainer *pPVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  uint *balance;
  uint *puVar8;
  Clause *pCVar9;
  pointer puVar10;
  ulong uVar11;
  uint *puVar12;
  HandlerList *pHVar13;
  uint *puVar14;
  uint uVar15;
  ulong uVar16;
  uniform_int_distribution<int> local_30;
  
  if (this->_randomize == true) {
    local_30._M_param._M_b = this->_ratioSum - 1;
    local_30._M_param._M_a = 0;
    uVar7 = std::uniform_int_distribution<int>::operator()
                      (&local_30,&Lib::Random::_eng,&local_30._M_param);
    puVar14 = (this->_ratios).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar15 = *puVar14;
    uVar16 = 0;
    if (uVar15 <= uVar7) {
      uVar16 = 0;
      do {
        uVar7 = uVar7 - uVar15;
        uVar16 = (ulong)((int)uVar16 + 1);
        uVar15 = puVar14[uVar16];
      } while (uVar15 <= uVar7);
    }
  }
  else {
    puVar8 = (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->_balances).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar14 = puVar8 + 1;
    puVar12 = puVar8;
    if (puVar14 != puVar3 && puVar8 != puVar3) {
      uVar15 = *puVar8;
      do {
        if (*puVar14 < uVar15) {
          puVar12 = puVar14;
          uVar15 = *puVar14;
        }
        puVar14 = puVar14 + 1;
      } while (puVar14 != puVar3);
    }
    uVar15 = *puVar12;
    uVar16 = (ulong)((long)puVar12 - (long)puVar8) >> 2;
    uVar11 = (long)puVar12 - (long)puVar8 & 0x3fffffffc;
    piVar1 = (int *)((long)puVar8 + uVar11);
    *piVar1 = *piVar1 + *(int *)((long)(this->_invertedRatios).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar11);
    for (; puVar8 != puVar3; puVar8 = puVar8 + 1) {
      *puVar8 = *puVar8 - uVar15;
    }
  }
  uVar15 = (uint)uVar16;
  uVar16 = uVar16 & 0xffffffff;
  puVar10 = (this->_queues).
            super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (long)(this->_queues).
                 super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 3;
  if ((long)uVar16 < (long)uVar11) {
    do {
      cVar6 = (**(code **)(*(long *)puVar10[uVar16]._M_t.
                                    super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                    ._M_t + 0x28))();
      puVar10 = (this->_queues).
                super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (this->_queues).
               super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (cVar6 == '\0') {
        uVar11 = (long)puVar2 - (long)puVar10 >> 3;
        break;
      }
      uVar16 = (ulong)((int)uVar16 + 1);
      uVar11 = (long)puVar2 - (long)puVar10 >> 3;
    } while ((long)uVar16 < (long)uVar11);
  }
  if (uVar11 == uVar16) {
    do {
      uVar15 = uVar15 - 1;
      uVar16 = (ulong)uVar15;
      cVar6 = (**(code **)(*(long *)(this->_queues).
                                    super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_t.
                                    super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                    ._M_t + 0x28))();
    } while (cVar6 != '\0');
    puVar10 = (this->_queues).
              super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  pCVar9 = (Clause *)
           (**(code **)(*(long *)puVar10[uVar16]._M_t.
                                 super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                 ._M_t + 0x30))();
  if ((this->_layeredArrangement == true) &&
     (puVar10 = (this->_queues).
                super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (this->_queues).
     super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != puVar10)) {
    uVar11 = 0;
    uVar16 = 1;
    do {
      pPVar4 = puVar10[uVar11]._M_t.
               super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
               ._M_t.
               super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
               .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl;
      (**(code **)(*(long *)&(pPVar4->super_RandomAccessClauseContainer).super_ClauseContainer +
                  0x20))(pPVar4,pCVar9);
      puVar10 = (this->_queues).
                super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = uVar16 < (ulong)((long)(this->_queues).
                                     super__Vector_base<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 3
                              );
      uVar11 = uVar16;
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (bVar5);
  }
  for (pHVar13 = (this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.
                 super_ClauseContainer.selectedEvent.super_BaseEvent._handlers;
      pHVar13 != (HandlerList *)0x0; pHVar13 = pHVar13->_tail) {
    (*pHVar13->_head->_vptr_HandlerStruct[2])(pHVar13->_head,pCVar9);
  }
  return pCVar9;
}

Assistant:

Clause* PredicateSplitPassiveClauseContainer::popSelected()
{
  unsigned queueIndex;

  if (_randomize) {
    unsigned toss = Random::getInteger(_ratioSum);
    // cout << "metaqueue " << _name << " toss " << toss << " (below: " << _ratioSum << ")";
    queueIndex = 0;
    while (toss >= _ratios[queueIndex]) {
      toss -= _ratios[queueIndex];
      queueIndex++;
    }
    // cout << " means " << queueIndex << " (below: " << _ratios.size() << ")" << endl;
  } else {
    // compute queue from which we will pick a clause:
    // choose queue using weighted round robin
    auto minElementIt = std::min_element(_balances.begin(), _balances.end());
    auto minElement = *minElementIt; // need to save the value of the min element before updating it to a new value, since it may not remain the minimal element after the update

    queueIndex = std::distance(_balances.begin(), minElementIt);

    _balances[queueIndex] += _invertedRatios[queueIndex];
    for (auto& balance : _balances)
    {
      balance -= minElement;
    }
  }

  // if chosen queue is empty, use the next queue to the right
  // this succeeds in a multi-split-queue-non-LRS-setting where we have the invariant that each clause from queue i is contained in queue j if i<j
  auto currIndex = queueIndex;
  while (currIndex < (long int)_queues.size() && _queues[currIndex]->isEmpty())
  {
    currIndex++;
  }
  // for tammet-style-queues or in the presence of LRS, we need to also consider the queues to the left as additional fallback (using the invar: at least one queue has at least one clause if popSelected is called)
  if (currIndex == (long int)_queues.size())
  {
    // fallback: try remaining queues, at least one of them must be nonempty
    ASS(queueIndex > 0); // otherwise we would already have searched through all queues
    currIndex = queueIndex - 1;
    while (_queues[currIndex]->isEmpty())
    {
      currIndex--;
      ASS(currIndex >= 0);
    }
  }
  ASS(!_queues[currIndex]->isEmpty());

  // pop clause from selected queue
  auto cl = _queues[currIndex]->popSelected();
  ASS(cl->store() == Clause::PASSIVE);

  // note: for a non-layered arrangement, the clause only occured in _queues[currIndex] (from which it was just removed using popSelected(), so we don't need any additional clause-removal
  if (_layeredArrangement)
  {
    // remove clause from all queues
    for (unsigned i = 0; i < _queues.size(); i++)
    {
      _queues[i]->remove(cl);
    }
  }

  selectedEvent.fire(cl);

  return cl;
}